

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_false,_true>::insert_edge_(DaTrie<false,_false,_true> *this,Query *query)

{
  uint uVar1;
  pointer pBVar2;
  ulong uVar3;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((uint)(byte)query->key_[query->pos_] ^
                 *(uint *)(pBVar2 + query->node_pos_) & 0x7fffffff);
  if ((long)pBVar2[uVar3] < 0) {
    solve_(this,query);
    uVar3 = (ulong)((uint)(byte)query->key_[query->pos_] ^
                   *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start + query->node_pos_) &
                   0x7fffffff);
  }
  fix_(this,(uint32_t)uVar3,&this->blocks_);
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2[uVar3] =
       (Bc)((ulong)pBVar2[uVar3] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  query->node_pos_ = (uint32_t)uVar3;
  uVar1 = query->pos_;
  query->pos_ = uVar1 + 1;
  query->is_finished_ = query->key_[uVar1] == '\0';
  return;
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }